

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_reader_tests.cpp
# Opt level: O2

void check_decode_bson(vector<unsigned_char,_std::allocator<unsigned_char>_> *v,json *expected)

{
  pointer puVar1;
  pointer puVar2;
  json j2;
  json result;
  AssertionHandler catchAssertionHandler_1;
  string s;
  BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
  local_210;
  SourceLineInfo local_1e0;
  StringRef local_1d0;
  StringRef local_1c0;
  istringstream is;
  
  _is = (_func_int **)(jsoncons::bson::bson_decode_options::vtable + 0x18);
  jsoncons::bson::
  decode_bson<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
            ((bson *)&result,v,(bson_decode_options *)&is);
  catchAssertionHandler_1.m_assertionInfo.macroName.m_start = "REQUIRE";
  catchAssertionHandler_1.m_assertionInfo.macroName.m_size = 7;
  local_210.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x65afef;
  local_210.super_ITransientExpression.m_isBinaryExpression = true;
  local_210.super_ITransientExpression.m_result = false;
  local_210.super_ITransientExpression._10_6_ = 0;
  Catch::StringRef::StringRef(&local_1c0,"result == expected");
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&is,(StringRef *)&catchAssertionHandler_1,
             (SourceLineInfo *)&local_210,local_1c0,Normal);
  local_210.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)&result;
  Catch::ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>::
  operator==((BinaryExpr<const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&,_const_jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>_&>
              *)&catchAssertionHandler_1,
             (ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
              *)&local_210,expected);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&is,(ITransientExpression *)&catchAssertionHandler_1);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_1);
  Catch::AssertionHandler::complete((AssertionHandler *)&is);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&is);
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  puVar1 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (puVar2 = (v->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_start; puVar2 != puVar1; puVar2 = puVar2 + 1) {
    std::__cxx11::string::push_back((char)&s);
  }
  std::__cxx11::istringstream::istringstream((istringstream *)&is,(string *)&s,_S_in);
  catchAssertionHandler_1.m_assertionInfo.lineInfo.file._0_4_ = 0x400;
  catchAssertionHandler_1.m_assertionInfo.macroName.m_start =
       jsoncons::bson::bson_decode_options::vtable + 0x18;
  catchAssertionHandler_1.m_assertionInfo.macroName.m_size = 0x998018;
  jsoncons::bson::
  decode_bson<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>>
            ((bson *)&j2,(istream *)&is,(bson_decode_options *)&catchAssertionHandler_1);
  local_210.super_ITransientExpression._vptr_ITransientExpression = (_func_int **)0x65aae6;
  local_210.super_ITransientExpression.m_isBinaryExpression = true;
  local_210.super_ITransientExpression.m_result = false;
  local_210.super_ITransientExpression._10_6_ = 0;
  local_1e0.file =
       "/workspace/llm4binary/github/license_c_cmakelists/danielaparker[P]jsoncons/test/bson/src/bson_reader_tests.cpp"
  ;
  local_1e0.line = 0x1c;
  Catch::StringRef::StringRef(&local_1d0,"j2 == expected");
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_1,(StringRef *)&local_210,&local_1e0,local_1d0,Normal);
  local_1e0.file = (char *)&j2;
  Catch::ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>::
  operator==(&local_210,
             (ExprLhs<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>const&>
              *)&local_1e0,expected);
  Catch::AssertionHandler::handleExpr
            (&catchAssertionHandler_1,&local_210.super_ITransientExpression);
  Catch::ITransientExpression::~ITransientExpression(&local_210.super_ITransientExpression);
  Catch::AssertionHandler::complete(&catchAssertionHandler_1);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_1);
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json(&j2);
  std::__cxx11::istringstream::~istringstream((istringstream *)&is);
  std::__cxx11::string::~string((string *)&s);
  jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::~basic_json(&result);
  return;
}

Assistant:

void check_decode_bson(const std::vector<uint8_t>& v, const json& expected)
{
    json result = bson::decode_bson<json>(v);
    REQUIRE(result == expected);

    std::string s;
    for (auto c : v)
    {
        s.push_back(c);
    }
    std::istringstream is(s);
    json j2 = bson::decode_bson<json>(is);
    REQUIRE(j2 == expected);
}